

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall
testing::internal::ForkingDeathTest::ForkingDeathTest
          (ForkingDeathTest *this,char *a_statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  
  peVar1 = (matcher->
           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ).impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (matcher->
           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ).impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (matcher->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (matcher->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  DeathTest::DeathTest((DeathTest *)this);
  (this->super_DeathTestImpl).statement_ = a_statement;
  (this->super_DeathTestImpl).matcher_.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  (this->super_DeathTestImpl).matcher_.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  (this->super_DeathTestImpl).matcher_.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0014b878;
  (this->super_DeathTestImpl).spawned_ = false;
  (this->super_DeathTestImpl).status_ = -1;
  (this->super_DeathTestImpl).outcome_ = IN_PROGRESS;
  (this->super_DeathTestImpl).read_fd_ = -1;
  (this->super_DeathTestImpl).write_fd_ = -1;
  (this->super_DeathTestImpl).super_DeathTest._vptr_DeathTest =
       (_func_int **)&PTR__DeathTestImpl_0014b198;
  *(undefined4 *)&(this->super_DeathTestImpl).field_0x3c = 0xffffffff;
  return;
}

Assistant:

ForkingDeathTest::ForkingDeathTest(const char* a_statement,
                                   Matcher<const std::string&> matcher)
    : DeathTestImpl(a_statement, std::move(matcher)), child_pid_(-1) {}